

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::Span<QHashPrivate::Node<QString,_QList<QString>_>_>::erase
          (Span<QHashPrivate::Node<QString,_QList<QString>_>_> *this,size_t bucket)

{
  undefined8 *puVar1;
  Span<QHashPrivate::Node<QString,_QList<QString>_>_> SVar2;
  long lVar3;
  int *piVar4;
  ulong uVar5;
  
  SVar2 = this[bucket];
  this[bucket] = (Span<QHashPrivate::Node<QString,_QList<QString>_>_>)0xff;
  lVar3 = *(long *)(this + 0x80);
  uVar5 = (ulong)((uint)(byte)SVar2 * 0x30);
  puVar1 = (undefined8 *)(lVar3 + uVar5);
  QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)(puVar1 + 3));
  piVar4 = (int *)*puVar1;
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      QArrayData::deallocate(*(QArrayData **)(lVar3 + uVar5),2,0x10);
    }
  }
  *(Span<QHashPrivate::Node<QString,_QList<QString>_>_> *)
   (*(long *)(this + 0x80) + (ulong)((uint)(byte)SVar2 * 0x30)) = this[0x89];
  this[0x89] = SVar2;
  return;
}

Assistant:

void erase(size_t bucket) noexcept(std::is_nothrow_destructible<Node>::value)
    {
        Q_ASSERT(bucket < SpanConstants::NEntries);
        Q_ASSERT(offsets[bucket] != SpanConstants::UnusedEntry);

        unsigned char entry = offsets[bucket];
        offsets[bucket] = SpanConstants::UnusedEntry;

        entries[entry].node().~Node();
        entries[entry].nextFree() = nextFree;
        nextFree = entry;
    }